

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_status(lysp_ctx *ctx,lysp_stmt *stmt,uint16_t *flags,lysp_ext_instance **exts)

{
  int iVar1;
  int iVar2;
  LY_ERR LVar3;
  size_t sVar4;
  char *pcVar5;
  ly_ctx *local_60;
  ly_ctx *local_58;
  ly_ctx *local_50;
  lysp_stmt *plStack_40;
  LY_ERR ret___1;
  lysp_stmt *child;
  LY_ERR ret__;
  int arg_len;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if ((*flags & 0x1c) == 0) {
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      sVar4 = strlen(stmt->arg);
      iVar2 = (int)sVar4;
      if ((iVar2 == 7) && (iVar1 = strncmp(stmt->arg,"current",7), iVar1 == 0)) {
        *flags = *flags | 4;
      }
      else if ((iVar2 == 10) && (iVar1 = strncmp(stmt->arg,"deprecated",10), iVar1 == 0)) {
        *flags = *flags | 8;
      }
      else {
        if ((iVar2 != 8) || (iVar2 = strncmp(stmt->arg,"obsolete",8), iVar2 != 0)) {
          if (ctx == (lysp_ctx *)0x0) {
            local_58 = (ly_ctx *)0x0;
          }
          else {
            local_58 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(local_58,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  sVar4 & 0xffffffff,stmt->arg,"status");
          return LY_EVALID;
        }
        *flags = *flags | 0x10;
      }
      for (plStack_40 = stmt->child; plStack_40 != (lysp_stmt *)0x0; plStack_40 = plStack_40->next)
      {
        if (plStack_40->kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_ctx *)0x0) {
            local_60 = (ly_ctx *)0x0;
          }
          else {
            local_60 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar5 = lyplg_ext_stmt2str(plStack_40->kw);
          ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,"status");
          return LY_EVALID;
        }
        LVar3 = lysp_stmt_ext(ctx,plStack_40,LY_STMT_STATUS,0,exts);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_50 = (ly_ctx *)0x0;
    }
    else {
      local_50 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_50,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","status");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_status(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint16_t *flags, struct lysp_ext_instance **exts)
{
    int arg_len;

    if (*flags & LYS_STATUS_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "status");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);
    if ((arg_len == ly_strlen_const("current")) && !strncmp(stmt->arg, "current", arg_len)) {
        *flags |= LYS_STATUS_CURR;
    } else if ((arg_len == ly_strlen_const("deprecated")) && !strncmp(stmt->arg, "deprecated", arg_len)) {
        *flags |= LYS_STATUS_DEPRC;
    } else if ((arg_len == ly_strlen_const("obsolete")) && !strncmp(stmt->arg, "obsolete", arg_len)) {
        *flags |= LYS_STATUS_OBSLT;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "status");
        return LY_EVALID;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_STATUS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "status");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}